

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_fwd_alen(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  uint uVar5;
  int iVar6;
  AliasRet AVar7;
  TRef TVar8;
  IRRef1 *pIVar9;
  ulong uVar10;
  uint ta;
  
  uVar2 = (J->fold).ins.field_0.op1;
  pIVar9 = J->chain + 0x4b;
  do {
    uVar3 = *pIVar9;
    ta = (uint)uVar2;
    uVar5 = ta;
    if (uVar3 <= uVar2) break;
    pIVar4 = (J->cur).ir;
    uVar10 = (ulong)*(ushort *)((long)pIVar4 + (ulong)pIVar4[uVar3].field_0.op1 * 8 + 2);
    if (*(char *)((long)pIVar4 + uVar10 * 8 + 5) == '\x1e') {
      uVar10 = (ulong)pIVar4[uVar10].field_0.op1;
    }
    pIVar9 = &(&pIVar4->field_0)[uVar3].prev;
    uVar5 = (uint)uVar3;
  } while ((*(byte *)((long)pIVar4 + uVar10 * 8 + 4) & 0x1f) != 0xe);
  pIVar9 = J->chain + 0x49;
  do {
    uVar3 = *pIVar9;
    if (uVar3 <= uVar5) goto LAB_00123a95;
    pIVar4 = (J->cur).ir;
    pIVar9 = &pIVar4[uVar3].field_0.prev;
  } while (pIVar4[uVar3].field_0.op1 != uVar2);
  iVar6 = fwd_aa_tab_clear(J,(uint)uVar3,ta);
  if (iVar6 != 0) {
    pIVar9 = J->chain + 0x4a;
    while( true ) {
      if (*pIVar9 <= uVar3) {
        return (TRef)uVar3;
      }
      pIVar1 = pIVar4 + *pIVar9;
      if (uVar2 == pIVar4[pIVar4[(pIVar1->field_0).op1].field_0.op1].field_0.op1) break;
      AVar7 = aa_table(J,ta,(uint)pIVar4[pIVar4[(pIVar1->field_0).op1].field_0.op1].field_0.op1);
      if (AVar7 == ALIAS_NO) goto LAB_00123a95;
      pIVar9 = &(pIVar1->field_0).prev;
    }
    if (((pIVar1->field_1).t.irt & 0x1f) != 0) {
      uVar2 = *(ushort *)((long)pIVar4 + (ulong)(pIVar1->field_0).op1 * 8 + 2);
      uVar10 = (ulong)uVar2;
      if ((((*(char *)((long)pIVar4 + uVar10 * 8 + 5) == ')') &&
           (pIVar4[uVar10].field_0.op1 == uVar3)) &&
          (uVar10 = (ulong)*(ushort *)((long)pIVar4 + uVar10 * 8 + 2),
          *(char *)((long)pIVar4 + uVar10 * 8 + 5) == '\x17')) && (pIVar4[uVar10].field_1.op12 == 1)
         ) {
        (J->fold).ins.field_0.op2 = uVar2;
      }
    }
  }
LAB_00123a95:
  TVar8 = lj_ir_emit(J);
  return TVar8;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_alen(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for ALEN. */
      break;
    }
    ref = store->prev;
  }

  /* Try to find a matching ALEN. */
  ref = J->chain[IR_ALEN];
  while (ref > lim) {
    /* CSE for ALEN only depends on the table, not the hint. */
    if (IR(ref)->op1 == tab) {
      IRRef sref;

      /* Search for aliasing table.clear. */
      if (!fwd_aa_tab_clear(J, ref, tab))
	break;

      /* Search for hint-forwarding or conflicting store. */
      sref = J->chain[IR_ASTORE];
      while (sref > ref) {
	IRIns *store = IR(sref);
	IRIns *aref = IR(store->op1);
	IRIns *fref = IR(aref->op1);
	if (tab == fref->op1) {  /* ASTORE to the same table. */
	  /* Detect t[#t+1] = x idiom for push. */
	  IRIns *idx = IR(aref->op2);
	  if (!irt_isnil(store->t) &&
	      idx->o == IR_ADD && idx->op1 == ref &&
	      IR(idx->op2)->o == IR_KINT && IR(idx->op2)->i == 1) {
	    /* Note: this requires an extra PHI check in loop unroll. */
	    fins->op2 = aref->op2;  /* Set ALEN hint. */
	  }
	  goto doemit;  /* Conflicting store, possibly giving a hint. */
	} else if (aa_table(J, tab, fref->op1) == ALIAS_NO) {
	  goto doemit;  /* Conflicting store. */
	}
	sref = store->prev;
      }

      return ref;  /* Plain ALEN forwarding. */
    }
    ref = IR(ref)->prev;
  }
doemit:
  return EMITFOLD;
}